

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FMultiBlockLinesIterator::FMultiBlockLinesIterator
          (FMultiBlockLinesIterator *this,FPortalGroupArray *check,AActor *origin,double checkradius
          )

{
  double dVar1;
  sector_t *psVar2;
  double dVar3;
  short sVar4;
  
  this->checklist = check;
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  dVar1 = (origin->__Pos).Z;
  (this->checkpoint).Z = dVar1;
  dVar3 = (origin->__Pos).Y;
  (this->checkpoint).X = (origin->__Pos).X;
  (this->checkpoint).Y = dVar3;
  if (check->inited == false) {
    P_CollectConnectedGroups
              (origin->Sector->PortalGroup,&this->checkpoint,dVar1 + origin->Height,checkradius,
               check);
  }
  if ((checkradius == -1.0) && (!NAN(checkradius))) {
    checkradius = origin->radius;
  }
  (this->checkpoint).Z = checkradius;
  psVar2 = origin->Sector;
  sVar4 = (short)psVar2->PortalGroup;
  this->basegroup = sVar4;
  this->startsector = psVar2;
  this->continueup = true;
  this->continuedown = true;
  this->portalflags = 0;
  this->index = -1;
  startIteratorForGroup(this,(int)sVar4);
  return;
}

Assistant:

FMultiBlockLinesIterator::FMultiBlockLinesIterator(FPortalGroupArray &check, AActor *origin, double checkradius)
	: checklist(check)
{
	checkpoint = origin->Pos();
	if (!check.inited) P_CollectConnectedGroups(origin->Sector->PortalGroup, checkpoint, origin->Top(), checkradius, checklist);
	checkpoint.Z = checkradius == -1? origin->radius : checkradius;
	basegroup = origin->Sector->PortalGroup;
	startsector = origin->Sector;
	Reset();
}